

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightconf_sample.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  long lVar2;
  char *__s;
  pointer ppVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  return_type<std::__cxx11::basic_string<char>_> psVar10;
  undefined8 extraout_RAX;
  size_t __nbytes;
  ulong uVar11;
  uint uVar12;
  person *x;
  pointer ppVar13;
  permission *p_1;
  pointer ppVar14;
  allocator local_359;
  undefined1 local_358 [32];
  vector<person,_std::allocator<person>_> users;
  string command;
  string source;
  string filename;
  group config_group;
  ofstream stream;
  undefined4 uStack_234;
  _Alloc_hider local_230;
  undefined1 local_228 [16];
  byte abStack_218 [8];
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  vector<permission,_std::allocator<permission>_> local_1f0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  undefined8 auStack_150 [36];
  
  if (argc < 2) {
    usage();
    iVar7 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&filename,"users.config",(allocator *)&stream);
    config_group.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &config_group.values_._M_t._M_impl.super__Rb_tree_header._M_header;
    config_group.values_._M_t._M_impl._0_8_ = 0;
    config_group.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    config_group.values_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    config_group.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    config_group.values_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    config_group.order_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    config_group.order_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    config_group.order_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    config_group.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         config_group.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string((string *)&source,"",(allocator *)&stream);
    std::ifstream::ifstream(&stream,(string *)&filename,_S_in);
    lVar2 = *(long *)(CONCAT44(uStack_234,_stream) + -0x18);
    if ((abStack_218[lVar2] & 5) == 0) {
      command._M_dataplus._M_p = (pointer)&command.field_2;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&command,*(undefined8 *)((long)auStack_150 + lVar2),0xffffffffffffffff,0,
                 0xffffffff);
      std::__cxx11::string::operator=((string *)&source,(string *)&command);
      std::__cxx11::string::~string((string *)&command);
      lightconf::config_format::read((int)&command,&source,__nbytes);
    }
    else {
      command.field_2._8_8_ = &command._M_string_length;
      command._M_dataplus._M_p = (pointer)0x0;
      command._M_string_length = 0;
      command.field_2._M_allocated_capacity = 0;
    }
    lightconf::group::operator=(&config_group,(group *)&command);
    lightconf::group::~group((group *)&command);
    std::ifstream::~ifstream(&stream);
    std::__cxx11::string::string((string *)&command,argv[1],(allocator *)&stream);
    lightconf::path::path((path *)&stream,"users",'.');
    local_358._0_8_ = (pointer)0x0;
    local_358._8_8_ = (pointer)0x0;
    local_358._16_8_ = (pointer)0x0;
    lightconf::group::get<std::vector<person,std::allocator<person>>>
              (&users,&config_group,(path *)&stream,
               (vector<person,_std::allocator<person>_> *)local_358);
    std::vector<person,_std::allocator<person>_>::~vector
              ((vector<person,_std::allocator<person>_> *)local_358);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stream);
    bVar5 = std::operator==(&command,"setmaintainer");
    if (bVar5) {
      if (argc != 3) {
LAB_0010f48a:
        argfail();
        std::vector<person,_std::allocator<person>_>::~vector(&users);
        std::__cxx11::string::~string((string *)&command);
        std::__cxx11::string::~string((string *)&source);
        lightconf::group::~group(&config_group);
        std::__cxx11::string::~string((string *)&filename);
        _Unwind_Resume(extraout_RAX);
      }
      lightconf::path::path((path *)local_358,"global.maintainer",'.');
      std::__cxx11::string::string((string *)&stream,argv[2],&local_359);
      lightconf::group::set<std::__cxx11::string>
                (&config_group,(path *)local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream);
      std::__cxx11::string::~string((string *)&stream);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_358);
      poVar8 = std::operator<<((ostream *)&std::cout,"Maintainer set to ");
      poVar8 = std::operator<<(poVar8,argv[2]);
      std::operator<<(poVar8,".\n");
    }
    else {
      bVar5 = std::operator==(&command,"adduser");
      if (bVar5) {
        if (argc != 9) goto LAB_0010f48a;
        local_230._M_p = local_228 + 8;
        local_228._0_8_ = 0;
        local_228[8] = '\0';
        local_210._M_p = (pointer)&local_200;
        local_208 = 0;
        local_200._M_local_buf[0] = '\0';
        local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        _stream = atoi(argv[2]);
        std::__cxx11::string::assign((char *)&local_230);
        std::__cxx11::string::assign((char *)&local_210);
        uVar12 = 0;
        while( true ) {
          __s = argv[5];
          sVar9 = strlen(__s);
          if (sVar9 <= uVar12) break;
          cVar1 = __s[uVar12];
          if (cVar1 == 'C') {
            local_358._0_4_ = 1;
            std::vector<permission,_std::allocator<permission>_>::emplace_back<permission>
                      (&local_1f0,(permission *)local_358);
          }
          else if (cVar1 == 'D') {
            local_358._0_4_ = 2;
            std::vector<permission,_std::allocator<permission>_>::emplace_back<permission>
                      (&local_1f0,(permission *)local_358);
          }
          else if (cVar1 == 'U') {
            local_358._0_4_ = 3;
            std::vector<permission,_std::allocator<permission>_>::emplace_back<permission>
                      (&local_1f0,(permission *)local_358);
          }
          else if (cVar1 == 'R') {
            local_358._0_8_ = (ulong)(uint)local_358._4_4_ << 0x20;
            std::vector<permission,_std::allocator<permission>_>::emplace_back<permission>
                      (&local_1f0,(permission *)local_358);
          }
          else {
            poVar8 = std::operator<<((ostream *)&std::cout,"Unknown permission letter: ");
            local_358._0_8_ = local_358 + 0x10;
            std::__cxx11::string::_M_construct((ulong)local_358,'\x01');
            poVar8 = std::operator<<(poVar8,(string *)local_358);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)local_358);
          }
          uVar12 = uVar12 + 1;
        }
        iVar6 = atoi(argv[6]);
        local_1d4 = iVar6;
        iVar7 = atoi(argv[7]);
        local_1d8 = iVar7;
        local_1d0 = atoi(argv[8]);
        if (iVar6 - 0x20U < 0xffffffe1) {
          std::operator<<((ostream *)&std::cout,"Day out of range [1-31], adjusted to 1.\n");
          local_1d4 = 1;
          iVar7 = local_1d8;
        }
        if (iVar7 - 0xdU < 0xfffffff4) {
          std::operator<<((ostream *)&std::cout,"Month out of range [1-12], adjusted to 1.\n");
          local_1d8 = 1;
        }
        if (local_1d0 - 0x834U < 0xffffff7e) {
          std::operator<<((ostream *)&std::cout,"Year out of range [1970-2099], adjusted to 1970.\n"
                         );
          local_1d0 = 0x7b2;
        }
        do {
          if (users.super__Vector_base<person,_std::allocator<person>_>._M_impl.
              super__Vector_impl_data._M_start ==
              users.super__Vector_base<person,_std::allocator<person>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<person,_std::allocator<person>_>::push_back(&users,(value_type *)&stream);
            std::operator<<((ostream *)&std::cout,"User added.\n");
            goto LAB_0010f14b;
          }
          piVar4 = &(users.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                     super__Vector_impl_data._M_start)->userid;
          users.super__Vector_base<person,_std::allocator<person>_>._M_impl.super__Vector_impl_data.
          _M_start = users.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
        } while (*piVar4 != _stream);
        std::operator<<((ostream *)&std::cout,"User id already exists.\n");
LAB_0010f14b:
        person::~person((person *)&stream);
      }
      else {
        bVar5 = std::operator==(&command,"deluser");
        if (bVar5) {
          if (argc != 3) goto LAB_0010f48a;
          iVar7 = atoi(argv[2]);
          uVar12 = 0;
          do {
            uVar11 = (ulong)uVar12;
            if ((ulong)(((long)users.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)users.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x70) <= uVar11) {
              std::operator<<((ostream *)&std::cout,"User not found.\n");
              goto LAB_0010f374;
            }
            uVar12 = uVar12 + 1;
          } while (users.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11].userid != iVar7);
          std::vector<person,_std::allocator<person>_>::erase
                    (&users,users.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar11);
          std::operator<<((ostream *)&std::cout,"User deleted.\n");
        }
        else {
          bVar5 = std::operator==(&command,"print");
          if (bVar5) {
            poVar8 = std::operator<<((ostream *)&std::cout,"Maintainer: ");
            lightconf::path::path((path *)local_358,"global.maintainer",'.');
            std::__cxx11::string::string((string *)&stream,"<not set>",&local_359);
            psVar10 = lightconf::group::get<std::__cxx11::string>
                                (&config_group,(path *)local_358,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&stream);
            poVar8 = std::operator<<(poVar8,(string *)psVar10);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&stream);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_358);
            std::operator<<((ostream *)&std::cout,"Users:\n");
            for (ppVar13 = users.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                           super__Vector_impl_data._M_start;
                ppVar13 !=
                users.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                super__Vector_impl_data._M_finish; ppVar13 = ppVar13 + 1) {
              poVar8 = std::operator<<((ostream *)&std::cout,"    name:        ");
              poVar8 = std::operator<<(poVar8,(string *)&ppVar13->firstname);
              poVar8 = std::operator<<(poVar8," ");
              poVar8 = std::operator<<(poVar8,(string *)&ppVar13->lastname);
              std::operator<<(poVar8,"\n");
              poVar8 = std::operator<<((ostream *)&std::cout,"    uid:         ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,ppVar13->userid);
              std::operator<<(poVar8,"\n");
              std::operator<<((ostream *)&std::cout,"    permissions: ");
              ppVar3 = (ppVar13->perms).super__Vector_base<permission,_std::allocator<permission>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              for (ppVar14 = (ppVar13->perms).
                             super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                             super__Vector_impl_data._M_start; ppVar14 != ppVar3;
                  ppVar14 = ppVar14 + 1) {
                if ((ulong)*ppVar14 < 4) {
                  std::operator<<((ostream *)&std::cout,
                                  &DAT_00119a6c + *(int *)(&DAT_00119a6c + (ulong)*ppVar14 * 4));
                }
              }
              std::operator<<((ostream *)&std::cout,"\n");
              poVar8 = std::operator<<((ostream *)&std::cout,"    join date:   ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ppVar13->joindate).month);
              poVar8 = std::operator<<(poVar8,"/");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ppVar13->joindate).day);
              poVar8 = std::operator<<(poVar8,"/");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ppVar13->joindate).year);
              std::operator<<(poVar8,"\n");
              std::operator<<((ostream *)&std::cout,"\n");
            }
          }
        }
      }
    }
LAB_0010f374:
    lightconf::path::path((path *)&stream,"users",'.');
    lightconf::group::set<std::vector<person,std::allocator<person>>>
              (&config_group,(path *)&stream,&users);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stream);
    std::ofstream::ofstream(&stream,(string *)&filename,_S_out);
    if ((abStack_218[*(long *)(CONCAT44(uStack_234,_stream) + -0x18)] & 5) == 0) {
      lightconf::config_format::write((config_format *)local_358,(int)&config_group,&source,0x50);
      std::operator<<((ostream *)&stream,(string *)local_358);
      std::__cxx11::string::~string((string *)local_358);
      std::operator<<((ostream *)&std::cout,"Configuration saved.");
    }
    std::ofstream::~ofstream(&stream);
    std::vector<person,_std::allocator<person>_>::~vector(&users);
    std::__cxx11::string::~string((string *)&command);
    iVar7 = 0;
    std::__cxx11::string::~string((string *)&source);
    lightconf::group::~group(&config_group);
    std::__cxx11::string::~string((string *)&filename);
  }
  return iVar7;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc < 2) {
        usage();
        return 1;
    }

    std::string filename = "users.config";
    lightconf::group config_group;
    std::string source = "";
    try {
        std::ifstream stream(filename, std::ios::in);
        if (stream) {
            // If the file exists, load the configuration group from it
            source = std::string(std::istreambuf_iterator<char>(stream),
                std::istreambuf_iterator<char>());
            config_group = lightconf::config_format::read(source);
        } else {
            // If the file does not exist, just create an empty group
            config_group = lightconf::group();
        }
    } catch (const lightconf::parse_error& e) {
        std::cout << "Parse error (" << e.line() << ":" << e.col() << "): " << e.what();
        return 1;
    } catch (const std::exception& e) {
        std::cout << "Failed to read configuration file: " << e.what();
        return 1;
    }

    std::string command(argv[1]);
    std::vector<person> users = config_group.get<std::vector<person>>("users", {});

    if (command == "setmaintainer") {
        if (argc != 3) argfail();

        // Keys can be specified using full paths, and nonexistant parent groups will
        // be automatically created.
        config_group.set<std::string>("global.maintainer", argv[2]);
        std::cout << "Maintainer set to " << argv[2] << ".\n";
    } else if (command == "adduser") {
        if (argc != 9) argfail();
        person p;
        p.userid = atoi(argv[2]);
        p.firstname = argv[3];
        p.lastname = argv[4];
        for (unsigned int i = 0; i < strlen(argv[5]); i++) {
            if (argv[5][i] == 'R') p.perms.push_back(permission::READ);
            else if (argv[5][i] == 'C') p.perms.push_back(permission::CREATE);
            else if (argv[5][i] == 'U') p.perms.push_back(permission::UPDATE);
            else if (argv[5][i] == 'D') p.perms.push_back(permission::DELETE);
            else std::cout << "Unknown permission letter: " << std::string(1, argv[5][i]) << "\n";
        }
        p.joindate.day = atoi(argv[6]);
        p.joindate.month = atoi(argv[7]);
        p.joindate.year = atoi(argv[8]);

        if (p.joindate.day < 1 || p.joindate.day > 31) {
            std::cout << "Day out of range [1-31], adjusted to 1.\n";
            p.joindate.day = 1;
        }
        if (p.joindate.month < 1 || p.joindate.month > 12) {
            std::cout << "Month out of range [1-12], adjusted to 1.\n";
            p.joindate.month = 1;
        }
        if (p.joindate.year < 1970 || p.joindate.year > 2099) {
            std::cout << "Year out of range [1970-2099], adjusted to 1970.\n";
            p.joindate.year = 1970;
        }

        for (const auto& x : users) {
            if (x.userid == p.userid) {
                std::cout << "User id already exists.\n";
                goto save;
            }
        }
        users.push_back(p);
        std::cout << "User added.\n";
    } else if (command == "deluser") {
        if (argc != 3) argfail();
        int uid = atoi(argv[2]);
        for (unsigned int i = 0; i < users.size(); i++) {
            if (users[i].userid == uid) {
                users.erase(std::begin(users) + i);
                std::cout << "User deleted.\n";
                goto save;
            }
        }
        std::cout << "User not found.\n";
    } else if (command == "print") {
        std::cout << "Maintainer: "
            << config_group.get<std::string>("global.maintainer", "<not set>") << "\n";
        std::cout << "Users:\n";
        for (const auto& x : users) {
            std::cout << "    name:        " << x.firstname << " " << x.lastname << "\n";
            std::cout << "    uid:         " << x.userid << "\n";
            std::cout << "    permissions: ";
            for (const auto& p : x.perms) {
                if (p == permission::READ) std::cout << "read ";
                else if (p == permission::CREATE) std::cout << "create ";
                else if (p == permission::UPDATE) std::cout << "update ";
                else if (p == permission::DELETE) std::cout << "delete ";
            }
            std::cout << "\n";
            std::cout << "    join date:   " << x.joindate.month << "/"
                << x.joindate.day << "/" << x.joindate.year << "\n";
            std::cout << "\n";
        }
    }

save:
    config_group.set<std::vector<person>>("users", users);
    std::ofstream stream(filename, std::ios::out);
    if (stream) {
        stream << lightconf::config_format::write(config_group, source, 80);
        std::cout << "Configuration saved.";
    }
}